

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ivyCut.c
# Opt level: O3

int Ivy_ManSeqFindCut_int(Ivy_Man_t *p,Vec_Int_t *vFront,Vec_Int_t *vInside,int nSizeLimit)

{
  int *piVar1;
  int *piVar2;
  void *pvVar3;
  int iVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  long lVar8;
  uint uVar9;
  uint uVar10;
  int iVar11;
  uint uVar12;
  uint uVar13;
  long lVar14;
  bool bVar15;
  int LeavesBest [10];
  uint local_58 [10];
  
  iVar4 = vFront->nSize;
  if ((long)iVar4 < 1) {
LAB_00916ef8:
    iVar11 = 0;
  }
  else {
    piVar1 = vFront->pArray;
    uVar5 = 0xffffffff;
    lVar8 = 0;
    uVar13 = 99;
    do {
      uVar7 = piVar1[lVar8];
      if ((int)uVar7 < 1) {
        __assert_fail("Leaf > 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/ivy/ivyCut.c"
                      ,0x35,"int Ivy_NodeGetLeafCostOne(Ivy_Man_t *, int, Vec_Int_t *)");
      }
      if (p->vObjs->nSize <= (int)(uVar7 >> 8)) goto LAB_009170e8;
      piVar2 = (int *)p->vObjs->pArray[uVar7 >> 8];
      uVar12 = piVar2[2] & 0xf;
      uVar9 = 999;
      if (((uVar12 != 1) && (*piVar2 != 0)) &&
         (uVar10 = (uint)(uVar12 == 4) + (uVar7 & 0xff), uVar10 < 0x10)) {
        uVar9 = 0;
        uVar6 = 0;
        if (*(ulong *)(piVar2 + 4) != 0) {
          uVar6 = *(int *)(*(ulong *)(piVar2 + 4) & 0xfffffffffffffffe) << 8;
        }
        if ((uVar6 | uVar10) != 0) {
          if ((long)vInside->nSize < 1) {
            uVar9 = 1;
          }
          else {
            lVar14 = 0;
            do {
              if (vInside->pArray[lVar14] == (uVar6 | uVar10)) goto LAB_00916e1b;
              lVar14 = lVar14 + 1;
            } while (vInside->nSize != lVar14);
            uVar9 = 1;
          }
        }
LAB_00916e1b:
        if ((uVar12 != 4) && (uVar12 != 7)) {
          if (uVar12 - 7 < 0xfffffffe) {
            __assert_fail("Ivy_ObjIsNode(pNode)",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/ivy/ivyCut.c"
                          ,0x45,"int Ivy_NodeGetLeafCostOne(Ivy_Man_t *, int, Vec_Int_t *)");
          }
          iVar11 = 0;
          uVar12 = 0;
          if (*(ulong *)(piVar2 + 6) != 0) {
            uVar12 = *(int *)(*(ulong *)(piVar2 + 6) & 0xfffffffffffffffe) << 8;
          }
          if ((uVar12 | uVar10) != 0) {
            if (0 < (long)vInside->nSize) {
              lVar14 = 0;
              do {
                if (vInside->pArray[lVar14] == (uVar12 | uVar10)) goto LAB_00916e7b;
                lVar14 = lVar14 + 1;
              } while (vInside->nSize != lVar14);
            }
            iVar11 = 1;
          }
LAB_00916e7b:
          uVar9 = uVar9 + iVar11;
        }
      }
      bVar15 = uVar13 == uVar9;
      if (uVar9 < uVar13) {
        uVar5 = 1;
        local_58[0] = uVar7;
        if (uVar9 < 2) {
          if ((int)(iVar4 + uVar9 + -1) <= nSizeLimit) goto LAB_00916f0d;
          goto LAB_00916ef8;
        }
      }
      else {
        uVar9 = uVar13;
        if (bVar15) {
          lVar14 = (long)(int)uVar5;
          uVar5 = uVar5 + 1;
          local_58[lVar14] = uVar7;
        }
      }
      lVar8 = lVar8 + 1;
      uVar13 = uVar9;
    } while (lVar8 != iVar4);
    iVar11 = 0;
    if (uVar9 != 99) {
      if (2 < uVar9) {
        __assert_fail("CostBest < 3",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/ivy/ivyCut.c"
                      ,0x7d,"int Ivy_ManSeqFindCut_int(Ivy_Man_t *, Vec_Int_t *, Vec_Int_t *, int)")
        ;
      }
      iVar11 = 0;
      if ((int)(iVar4 + uVar9 + -1) <= nSizeLimit) {
        if ((int)uVar5 < 1) {
          __assert_fail("Counter > 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/ivy/ivyCut.c"
                        ,0x82,
                        "int Ivy_ManSeqFindCut_int(Ivy_Man_t *, Vec_Int_t *, Vec_Int_t *, int)");
        }
LAB_00916f0d:
        printf("%d",(ulong)uVar5);
        iVar4 = rand();
        uVar13 = local_58[iVar4 % (int)uVar5];
        if ((int)uVar13 < 0) {
          __assert_fail("LeafBest >= 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/ivy/ivyCut.c"
                        ,0x88,
                        "int Ivy_ManSeqFindCut_int(Ivy_Man_t *, Vec_Int_t *, Vec_Int_t *, int)");
        }
        iVar4 = vFront->nSize;
        if (0 < (long)iVar4) {
          piVar1 = vFront->pArray;
          lVar8 = 1;
LAB_00916f51:
          if (piVar1[lVar8 + -1] != uVar13) goto code_r0x00916f57;
          if ((int)lVar8 < iVar4) {
            do {
              piVar1[lVar8 + -1] = piVar1[lVar8];
              lVar8 = lVar8 + 1;
              iVar4 = vFront->nSize;
            } while ((int)lVar8 < iVar4);
          }
          vFront->nSize = iVar4 + -1;
          goto LAB_00916fa8;
        }
        if (iVar4 != 0) {
          __assert_fail("i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                        ,999,"int Vec_IntRemove(Vec_Int_t *, int)");
        }
LAB_00916fa8:
        if (p->vObjs->nSize <= (int)(uVar13 >> 8)) {
LAB_009170e8:
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecPtr.h"
                        ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
        }
        pvVar3 = p->vObjs->pArray[uVar13 >> 8];
        uVar5 = *(uint *)((long)pvVar3 + 8) & 0xf;
        if ((uVar5 != 7) && (uVar5 - 5 < 2 == (uVar5 == 4))) {
          __assert_fail("Ivy_ObjIsNode(pNode) || Ivy_ObjIsLatch(pNode) || Ivy_ObjIsBuf(pNode)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/ivy/ivyCut.c"
                        ,0x8f,
                        "int Ivy_ManSeqFindCut_int(Ivy_Man_t *, Vec_Int_t *, Vec_Int_t *, int)");
        }
        uVar13 = (uint)(uVar5 == 4) + (uVar13 & 0xff);
        if (*(ulong *)((long)pvVar3 + 0x10) == 0) {
          uVar7 = 0;
        }
        else {
          uVar7 = *(int *)(*(ulong *)((long)pvVar3 + 0x10) & 0xfffffffffffffffe) << 8;
        }
        uVar7 = uVar7 | uVar13;
        if (uVar7 != 0) {
          if (0 < (long)vInside->nSize) {
            lVar8 = 0;
            do {
              if (vInside->pArray[lVar8] == uVar7) goto LAB_00917046;
              lVar8 = lVar8 + 1;
            } while (vInside->nSize != lVar8);
          }
          Vec_IntPush(vFront,uVar7);
          Vec_IntPush(vInside,uVar7);
          uVar5 = *(uint *)((long)pvVar3 + 8) & 0xf;
        }
LAB_00917046:
        iVar11 = 1;
        if ((uVar5 != 4) && (uVar5 != 7)) {
          if (uVar5 - 7 < 0xfffffffe) {
            __assert_fail("Ivy_ObjIsNode(pNode)",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/ivy/ivyCut.c"
                          ,0x9d,
                          "int Ivy_ManSeqFindCut_int(Ivy_Man_t *, Vec_Int_t *, Vec_Int_t *, int)");
          }
          if (*(ulong *)((long)pvVar3 + 0x18) == 0) {
            uVar5 = 0;
          }
          else {
            uVar5 = *(int *)(*(ulong *)((long)pvVar3 + 0x18) & 0xfffffffffffffffe) << 8;
          }
          uVar5 = uVar5 | uVar13;
          if (uVar5 != 0) {
            if (0 < (long)vInside->nSize) {
              lVar8 = 0;
              do {
                if (vInside->pArray[lVar8] == uVar5) goto LAB_009170b7;
                lVar8 = lVar8 + 1;
              } while (vInside->nSize != lVar8);
            }
            Vec_IntPush(vFront,uVar5);
            Vec_IntPush(vInside,uVar5);
          }
LAB_009170b7:
          if (nSizeLimit < vFront->nSize) {
            __assert_fail("Vec_IntSize(vFront) <= nSizeLimit",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/ivy/ivyCut.c"
                          ,0xa7,
                          "int Ivy_ManSeqFindCut_int(Ivy_Man_t *, Vec_Int_t *, Vec_Int_t *, int)");
          }
        }
      }
    }
  }
  return iVar11;
code_r0x00916f57:
  bVar15 = lVar8 == iVar4;
  lVar8 = lVar8 + 1;
  if (bVar15) goto LAB_00916fa8;
  goto LAB_00916f51;
}

Assistant:

int Ivy_ManSeqFindCut_int( Ivy_Man_t * p, Vec_Int_t * vFront, Vec_Int_t * vInside, int nSizeLimit )
{
    Ivy_Obj_t * pNode;
    int CostBest, CostCur, Leaf, LeafBest, Next, nLatches, i;
    int LeavesBest[10];
    int Counter;

    // add random selection of the best fanin!!!

    // find the best fanin
    CostBest = 99;
    LeafBest = -1;
    Counter = -1;
//printf( "Evaluating fanins of the cut:\n" );
    Vec_IntForEachEntry( vFront, Leaf, i )
    {
        CostCur = Ivy_NodeGetLeafCostOne( p, Leaf, vInside );
//printf( "    Fanin %s has cost %d.\n", Ivy_ObjName(pNode), CostCur );
        if ( CostBest > CostCur )
        {
            CostBest = CostCur;
            LeafBest = Leaf;
            LeavesBest[0] = Leaf;
            Counter = 1;
        }
        else if ( CostBest == CostCur )
            LeavesBest[Counter++] = Leaf;

        if ( CostBest <= 1 ) // can be if ( CostBest <= 1 )
            break;
    }
    if ( CostBest == 99 )
        return 0;
//        return Ivy_NodeBuildCutLevelTwo_int( vInside, vFront, nFaninLimit );

    assert( CostBest < 3 );
    if ( Vec_IntSize(vFront) - 1 + CostBest > nSizeLimit )
        return 0;
//        return Ivy_NodeBuildCutLevelTwo_int( vInside, vFront, nFaninLimit );

    assert( Counter > 0 );
printf( "%d", Counter );

    LeafBest = LeavesBest[rand() % Counter];

    // remove the node from the array
    assert( LeafBest >= 0 );
    Vec_IntRemove( vFront, LeafBest );
//printf( "Removing fanin %s.\n", Ivy_ObjName(pNode) );

    // get the node and its latches
    pNode = Ivy_ManObj( p, Ivy_LeafId(LeafBest) );
    nLatches = Ivy_LeafLat(LeafBest) + Ivy_ObjIsLatch(pNode);
    assert( Ivy_ObjIsNode(pNode) || Ivy_ObjIsLatch(pNode) || Ivy_ObjIsBuf(pNode) );

    // add the left child to the fanins
    Next = Ivy_LeafCreate( Ivy_ObjFaninId0(pNode), nLatches );
    if ( Next && Vec_IntFind(vInside, Next) == -1 )
    {
//printf( "Adding fanin %s.\n", Ivy_ObjName(pNext) );
        Vec_IntPush( vFront, Next );
        Vec_IntPush( vInside, Next );
    }

    // quit if this is the one fanin node
    if ( Ivy_ObjIsLatch(pNode) || Ivy_ObjIsBuf(pNode) )
        return 1;
    assert( Ivy_ObjIsNode(pNode) );

    // add the right child to the fanins
    Next = Ivy_LeafCreate( Ivy_ObjFaninId1(pNode), nLatches );
    if ( Next && Vec_IntFind(vInside, Next) == -1 )
    {
//printf( "Adding fanin %s.\n", Ivy_ObjName(pNext) );
        Vec_IntPush( vFront, Next );
        Vec_IntPush( vInside, Next );
    }
    assert( Vec_IntSize(vFront) <= nSizeLimit );
    // keep doing this
    return 1;
}